

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

uint __thiscall kj::StringPtr::parseAs<unsigned_int>(StringPtr *this)

{
  unsigned_long_long uVar1;
  
  uVar1 = anon_unknown_55::parseUnsigned(this,0xffffffff);
  return (uint)uVar1;
}

Assistant:

T parseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseUnsigned(s, max));
  }
}